

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

int_type __thiscall procxx::pipe_streambuf::overflow(pipe_streambuf *this,int_type ch)

{
  int_type iVar1;
  undefined1 *puVar2;
  int_type ch_local;
  pipe_streambuf *this_local;
  
  iVar1 = std::char_traits<char>::eof();
  if (ch == iVar1) {
    this_local._4_4_ = std::char_traits<char>::eof();
  }
  else {
    puVar2 = (undefined1 *)std::streambuf::pptr();
    *puVar2 = (char)ch;
    std::streambuf::pbump((int)this);
    (**(code **)(*(long *)&this->super_pipe_ostreambuf + 0x78))();
    this_local._4_4_ = ch;
  }
  return this_local._4_4_;
}

Assistant:

int_type overflow(int_type ch) override {
    if (ch != traits_type::eof()) {
      *pptr() = static_cast<char>(ch);  // safe because of -1 in setp() in ctor
      pbump(1);
      flush();
      return ch;
    }

    return traits_type::eof();
  }